

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.hpp
# Opt level: O2

difference_type
ft::distance<ft::listIterator<int>>(listIterator<int> *first,listIterator<int> *last,type *param_3)

{
  difference_type dVar1;
  undefined **local_28;
  Node *local_20;
  undefined **local_18;
  Node *local_10;
  
  local_28 = &PTR__listIterator_0010dd60;
  local_20 = first->m_node;
  local_18 = &PTR__listIterator_0010dd60;
  local_10 = last->m_node;
  dVar1 = _distance<ft::listIterator<int>>(&local_28,&local_18);
  return dVar1;
}

Assistant:

typename ft::iterator_traits<InputIter>::difference_type
	distance(InputIter first, InputIter last,
			 typename ft::_void_t<typename ft::iterator_traits<InputIter>::iterator_category>::type * = 0) {
	return ft::_distance(first, last, typename ft::iterator_traits<InputIter>::iterator_category());
}